

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def<anurbs::Ref<anurbs::BrepEdge>(*)(anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepEdge>),pybind11::arg,pybind11::arg>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_Ref<anurbs::BrepEdge>_Model_ptr_unsigned_long_shared_ptr<anurbs::BrepEdge> **f,
          arg *extra,arg *extra_1)

{
  _func_Ref<anurbs::BrepEdge>_Model_ptr_unsigned_long_shared_ptr<anurbs::BrepEdge> *f_00;
  cpp_function cf;
  handle local_70;
  cpp_function local_68;
  handle local_60;
  is_method local_58;
  object local_50;
  name local_48;
  handle local_40;
  handle local_38;
  object local_30;
  
  f_00 = *f;
  local_58.class_.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48.value = name_;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68.super_function.super_object.super_handle.m_ptr = (function)(function)local_70.m_ptr;
  cpp_function::
  cpp_function<anurbs::Ref<anurbs::BrepEdge>,anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepEdge>,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            ((cpp_function *)&local_60,f_00,&local_48,&local_58,(sibling *)&local_68,extra,extra_1);
  object::~object((object *)&local_70);
  object::~object(&local_50);
  cpp_function::name(&local_68);
  local_40.m_ptr = *(PyObject **)this;
  if ((object)local_68.super_function.super_object.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)local_68.super_function.super_object.super_handle.m_ptr =
         *(long *)local_68.super_function.super_object.super_handle.m_ptr + 1;
  }
  local_38.m_ptr = (PyObject *)local_68.super_function.super_object.super_handle.m_ptr;
  local_58.class_.m_ptr = (handle)(PyObject *)0x0;
  local_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object((object *)&local_58);
  detail::accessor_policies::obj_attr::set(local_40,local_38,local_60);
  object::~object(&local_30);
  object::~object((object *)&local_38);
  object::~object((object *)&local_68);
  object::~object((object *)&local_60);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }